

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

double get_rate_correction_factor(AV1_COMP *cpi,int width,int height)

{
  double *pdVar1;
  int iVar2;
  aom_enc_pass aVar3;
  AV1_PRIMARY *pAVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  
  pAVar4 = cpi->ppi;
  iVar2 = (pAVar4->gf_group).frame_parallel_level[cpi->gf_frame_index];
  pdVar1 = (cpi->rc).frame_level_rate_correction_factors;
  pdVar5 = (pAVar4->p_rc).rate_correction_factors;
  if (0 < iVar2) {
    pdVar5 = (cpi->rc).frame_level_rate_correction_factors;
  }
  pdVar7 = (pAVar4->p_rc).rate_correction_factors;
  pdVar8 = pdVar7;
  pdVar6 = (pAVar4->p_rc).rate_correction_factors;
  if (0 < iVar2) {
    pdVar8 = pdVar1;
    pdVar6 = (cpi->rc).frame_level_rate_correction_factors;
  }
  if ((cpi->common).current_frame.frame_type == '\0') {
    dVar9 = pdVar5[3];
  }
  else {
    aVar3 = (cpi->oxcf).pass;
    if (aVar3 < AOM_RC_LAST_PASS) {
      dVar9 = pdVar6[2];
      if (((aVar3 != AOM_RC_ONE_PASS) || (cpi->compressor_stage != '\0')) ||
         (pAVar4->lap_enabled == 0)) {
        if (((((cpi->refresh_frame).alt_ref_frame == false) &&
             ((cpi->refresh_frame).golden_frame != true)) ||
            (((cpi->rc).is_src_frame_alt_ref != 0 || (pAVar4->use_svc != 0)))) ||
           (((cpi->oxcf).rc_cfg.mode == AOM_CBR && ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct < 0x15)))) {
          dVar9 = *pdVar8;
        }
        goto LAB_002002bc;
      }
    }
    if (0 < iVar2) {
      pdVar7 = pdVar1;
    }
    dVar9 = pdVar7["\x03"[(pAVar4->gf_group).update_type[cpi->gf_frame_index]]];
  }
LAB_002002bc:
  dVar9 = ((double)((cpi->oxcf).frm_dim_cfg.height * (cpi->oxcf).frm_dim_cfg.width) /
          (double)(height * width)) * dVar9;
  dVar10 = 50.0;
  if (dVar9 <= 50.0) {
    dVar10 = dVar9;
  }
  return (double)(-(ulong)(dVar9 < 0.005) & 0x3f747ae147ae147b |
                 ~-(ulong)(dVar9 < 0.005) & (ulong)dVar10);
}

Assistant:

static double get_rate_correction_factor(const AV1_COMP *cpi, int width,
                                         int height) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  double rcf;
  double rate_correction_factors_kfstd;
  double rate_correction_factors_gfarfstd;
  double rate_correction_factors_internormal;

  rate_correction_factors_kfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[KF_STD]
          : p_rc->rate_correction_factors[KF_STD];
  rate_correction_factors_gfarfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[GF_ARF_STD]
          : p_rc->rate_correction_factors[GF_ARF_STD];
  rate_correction_factors_internormal =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[INTER_NORMAL]
          : p_rc->rate_correction_factors[INTER_NORMAL];

  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    rcf = rate_correction_factors_kfstd;
  } else if (is_stat_consumption_stage(cpi)) {
    const RATE_FACTOR_LEVEL rf_lvl =
        get_rate_factor_level(&cpi->ppi->gf_group, cpi->gf_frame_index);
    double rate_correction_factors_rflvl =
        (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
            ? rc->frame_level_rate_correction_factors[rf_lvl]
            : p_rc->rate_correction_factors[rf_lvl];
    rcf = rate_correction_factors_rflvl;
  } else {
    if ((refresh_frame->alt_ref_frame || refresh_frame->golden_frame) &&
        !rc->is_src_frame_alt_ref && !cpi->ppi->use_svc &&
        (cpi->oxcf.rc_cfg.mode != AOM_CBR ||
         cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 20))
      rcf = rate_correction_factors_gfarfstd;
    else
      rcf = rate_correction_factors_internormal;
  }
  rcf *= resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height);
  return fclamp(rcf, MIN_BPB_FACTOR, MAX_BPB_FACTOR);
}